

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O3

fdb_status fdb_iterator_next(fdb_iterator *iterator)

{
  atomic<unsigned_long> *paVar1;
  atomic<unsigned_char> *paVar2;
  uint64_t *value_buf;
  wal_item_action wVar3;
  docio_handle *handle;
  snap_handle *shandle;
  size_t sVar4;
  fdb_status fVar5;
  int iVar6;
  hbtrie_result hVar7;
  wal_item *pwVar8;
  int64_t iVar9;
  byte bVar10;
  uint64_t uVar11;
  void *pvVar12;
  ulong uVar13;
  btree_result bVar14;
  fdb_status fVar15;
  bool bVar16;
  uint64_t offset;
  fdb_seqnum_t seqnum;
  uint64_t hboffset;
  int64_t _offset;
  fdb_kvs_id_t kv_id;
  fdb_doc doc_kv;
  size_t seq_kv_len;
  uint64_t local_158;
  size_t local_150;
  ulong local_148;
  uint64_t local_140;
  docio_object local_138;
  docio_handle *local_f8;
  ulong local_f0;
  uint64_t local_e8;
  fdb_kvs_id_t local_e0;
  fdb_doc local_d8;
  undefined1 local_88 [8];
  ulong local_80;
  docio_object local_78;
  size_t local_38;
  
  if (iterator == (fdb_iterator *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (iterator->handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  paVar2 = &iterator->handle->handle_busy;
  LOCK();
  bVar16 = (paVar2->super___atomic_base<unsigned_char>)._M_i == '\0';
  if (bVar16) {
    (paVar2->super___atomic_base<unsigned_char>)._M_i = '\x01';
  }
  UNLOCK();
  fVar15 = FDB_RESULT_HANDLE_BUSY;
  if (!bVar16) {
    return FDB_RESULT_HANDLE_BUSY;
  }
  if (iterator->hbtrie_iterator == (hbtrie_iterator *)0x0) {
    do {
      local_158 = 0xffffffffffffffff;
      local_138.length.keylen = 0;
      local_138.length.metalen = 0;
      local_138.length.bodylen = 0;
      local_138.length.bodylen_ondisk = 0;
      local_138.length.flag = '\0';
      local_138.length.checksum = '\0';
      local_138.length.reserved = 0;
      local_138.timestamp = 0;
      local_138.meta = (void *)0x0;
      local_138.body = (void *)0x0;
      local_138.key = (void *)0x0;
      local_138.field_3.seqnum = 0;
      if (iterator->direction != '\x01') {
        if (iterator->status == '\0') {
          iterator->_offset = 0xffffffffffffffff;
        }
        if (iterator->tree_cursor_prev != (wal_item *)0x0) {
          pwVar8 = wal_itr_search_greater(iterator->wal_itr,iterator->tree_cursor_prev);
          iterator->tree_cursor = pwVar8;
          iterator->status = '\0';
        }
      }
      bVar14 = BTREE_RESULT_FAIL;
      do {
        local_148 = iterator->_seqnum;
        handle = iterator->handle->dhandle;
        if (iterator->_offset == 0xffffffffffffffff) {
          if (iterator->handle->kvs == (kvs_info *)0x0) {
            bVar14 = btree_next(iterator->seqtree_iterator,&local_148,&local_158);
          }
          else {
            hVar7 = hbtrie_next(iterator->seqtrie_iterator,local_88,&local_38,&local_158);
            bVar14 = BTREE_RESULT_FAIL;
            if (hVar7 == HBTRIE_RESULT_SUCCESS) {
              buf2kvid(8,local_88,&local_e0);
              local_148 = local_80;
              bVar14 = (uint)(local_e0 != iterator->handle->kvs->id) * 2;
            }
          }
          btreeblk_end(iterator->handle->bhandle);
          if (bVar14 != BTREE_RESULT_SUCCESS) goto LAB_0012c33c;
          local_148 = local_148 >> 0x38 | (local_148 & 0xff000000000000) >> 0x28 |
                      (local_148 & 0xff0000000000) >> 0x18 | (local_148 & 0xff00000000) >> 8 |
                      (local_148 & 0xff000000) << 8 | (local_148 & 0xff0000) << 0x18 |
                      (local_148 & 0xff00) << 0x28 | local_148 << 0x38;
          iterator->_seqnum = local_148;
          if ((iterator->field_12).end_seqnum < local_148) {
            fVar15 = FDB_RESULT_ITERATOR_FAIL;
            goto LAB_0012c8af;
          }
          local_158 = local_158 >> 0x38 | (local_158 & 0xff000000000000) >> 0x28 |
                      (local_158 & 0xff0000000000) >> 0x18 | (local_158 & 0xff00000000) >> 8 |
                      (local_158 & 0xff000000) << 8 | (local_158 & 0xff0000) << 0x18 |
                      (local_158 & 0xff00) << 0x28 | local_158 << 0x38;
          iterator->_offset = 0xffffffffffffffff;
          iterator->status = '\0';
          bVar16 = true;
        }
        else {
LAB_0012c33c:
          if (bVar14 == BTREE_RESULT_FAIL) {
            pwVar8 = iterator->tree_cursor;
            fVar15 = FDB_RESULT_ITERATOR_FAIL;
            if (pwVar8 == (wal_item *)0x0) goto LAB_0012c8af;
            bVar16 = iterator->status == '\x01';
            goto LAB_0012c90d;
          }
          bVar16 = bVar14 == BTREE_RESULT_SUCCESS;
        }
        if ((!bVar16) || ((iterator->opt & 1) != 0)) goto LAB_0012c89f;
        local_138.key = (void *)0x0;
        local_138.length._0_8_ = local_138.length._0_8_ & 0xffffffffffff0000;
        local_138.meta = (void *)0x0;
        local_138.body = (void *)0x0;
        local_e8 = docio_read_doc_key_meta(handle,local_158,&local_138,true);
        if ((long)local_e8 < 1) {
          fVar15 = (fdb_status)local_e8;
          if (local_e8 == 0) {
            fVar15 = FDB_RESULT_KEY_NOT_FOUND;
          }
          goto LAB_0012c5dd;
        }
        if (((local_138.length._8_8_ & 0x400000000) != 0) && ((iterator->opt & 2) != 0)) {
          free(local_138.key);
          free(local_138.meta);
          fVar15 = FDB_RESULT_KEY_NOT_FOUND;
          goto LAB_0012c5dd;
        }
        local_d8.key = local_138.key;
        local_d8.keylen = local_138.length._0_8_ & 0xffff;
        local_d8.seqnum = 0xffffffffffffffff;
        shandle = iterator->handle->shandle;
        fVar5 = wal_find(shandle->snap_txn,iterator->handle->file,&shandle->cmp_info,shandle,
                         &local_d8,&local_e8);
        if (((fVar5 == FDB_RESULT_SUCCESS) &&
            ((void *)(iterator->field_10).start_seqnum <= local_d8.seqnum)) &&
           (local_d8.seqnum <= (void *)(iterator->field_12).end_seqnum)) {
LAB_0012c46c:
          free(local_138.key);
          pvVar12 = local_138.meta;
LAB_0012c476:
          free(pvVar12);
          iVar6 = 2;
        }
        else {
          local_78.length.keylen = 0;
          local_78.length.metalen = 0;
          local_78.length.bodylen = 0;
          local_78.length.bodylen_ondisk = 0;
          local_78.length.flag = '\0';
          local_78.length.checksum = '\0';
          local_78.length.reserved = 0;
          local_78.timestamp = 0;
          local_78.meta = (void *)0x0;
          local_78.body = (void *)0x0;
          local_78.key = (void *)0x0;
          local_78.field_3.seqnum = 0;
          hVar7 = hbtrie_find(iterator->handle->trie,local_138.key,(uint)local_138.length.keylen,
                              &local_f0);
          btreeblk_end(iterator->handle->bhandle);
          if (hVar7 != HBTRIE_RESULT_SUCCESS) goto LAB_0012c46c;
          local_78.key = local_138.key;
          local_f0 = local_f0 >> 0x38 | (local_f0 & 0xff000000000000) >> 0x28 |
                     (local_f0 & 0xff0000000000) >> 0x18 | (local_f0 & 0xff00000000) >> 8 |
                     (local_f0 & 0xff000000) << 8 | (local_f0 & 0xff0000) << 0x18 |
                     (local_f0 & 0xff00) << 0x28 | local_f0 << 0x38;
          local_78.meta = (void *)0x0;
          iVar9 = docio_read_doc_key_meta(iterator->handle->dhandle,local_f0,&local_78,true);
          if (0 < iVar9) {
            if ((local_78.field_3.seqnum <= local_138.field_3.seqnum) ||
               ((iterator->field_12).end_seqnum < local_78.field_3.seqnum)) {
              free(local_78.meta);
              free(local_138.key);
              free(local_138.meta);
              iVar6 = 0;
              goto LAB_0012c480;
            }
            free(local_138.key);
            free(local_138.meta);
            pvVar12 = local_78.meta;
            goto LAB_0012c476;
          }
          free(local_138.key);
          free(local_138.meta);
          fVar15 = (fdb_status)iVar9;
          if (iVar9 == 0) {
            fVar15 = FDB_RESULT_KEY_NOT_FOUND;
          }
          iVar6 = 1;
        }
LAB_0012c480:
        bVar14 = BTREE_RESULT_SUCCESS;
      } while (iVar6 == 2);
      if (iVar6 == 0) goto LAB_0012c89f;
LAB_0012c5dd:
    } while (fVar15 == FDB_RESULT_KEY_NOT_FOUND);
    goto LAB_0012c8af;
  }
  if (iterator->direction != '\x01') {
    iterator->_offset = 0xffffffffffffffff;
    if (iterator->tree_cursor == (wal_item *)0x0) {
      if (iterator->tree_cursor_prev != (wal_item *)0x0) {
        pwVar8 = wal_itr_search_greater(iterator->wal_itr,iterator->tree_cursor_prev);
        iterator->tree_cursor = pwVar8;
        iterator->status = '\0';
      }
    }
    else {
      pwVar8 = wal_itr_search_greater(iterator->wal_itr,iterator->tree_cursor);
      iterator->tree_cursor = pwVar8;
      if ((iterator->direction == '\x02') && (iterator->status != '\x01')) {
        pwVar8 = wal_itr_next(iterator->wal_itr);
        iterator->tree_cursor = pwVar8;
      }
    }
  }
  value_buf = &iterator->_offset;
  hVar7 = HBTRIE_RESULT_SUCCESS;
LAB_0012c613:
  do {
    pvVar12 = iterator->_key;
    local_f8 = iterator->handle->dhandle;
    if (iterator->_offset == 0xffffffffffffffff) {
      local_d8.keylen = 0;
      local_d8.metalen = 0;
      local_d8.bodylen = local_d8.bodylen & 0xffffffff00000000;
      local_d8.seqnum = 0;
      local_d8.offset = 0;
      local_d8.size_ondisk = 0;
      local_d8.key = (void *)0x0;
      do {
        do {
          hVar7 = hbtrie_next(iterator->hbtrie_iterator,pvVar12,&iterator->_keylen,value_buf);
          btreeblk_end(iterator->handle->bhandle);
          uVar13 = iterator->_offset;
          uVar13 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                   (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
                   (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                   (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38;
          iterator->_offset = uVar13;
          if (((iterator->opt & 2) == 0) || (hVar7 != HBTRIE_RESULT_SUCCESS)) goto LAB_0012c631;
          local_d8.key = (void *)0x0;
          local_d8.seqnum = 0;
          local_d8.bodylen = 0;
          local_d8.size_ondisk = 0;
          local_d8.keylen = 0;
          local_d8.metalen = 0;
          local_d8.offset = 0;
          iVar9 = docio_read_doc_key_meta(local_f8,uVar13,(docio_object *)&local_d8,true);
          sVar4 = local_d8.metalen;
        } while (iVar9 < 1);
        free((void *)local_d8.size_ondisk);
        free((void *)local_d8.seqnum);
      } while ((sVar4 & 0x400000000) != 0);
      hVar7 = HBTRIE_RESULT_SUCCESS;
    }
LAB_0012c631:
    if (hVar7 == HBTRIE_RESULT_INDEX_CORRUPTED) {
      fVar15 = FDB_RESULT_FILE_CORRUPTION;
      goto LAB_0012c8b7;
    }
    local_150 = iterator->_keylen;
    local_140 = *value_buf;
    if ((hVar7 != HBTRIE_RESULT_SUCCESS) && (iterator->tree_cursor == (wal_item *)0x0))
    goto LAB_0012c88d;
    do {
      pwVar8 = iterator->tree_cursor;
      uVar11 = local_140;
      if (pwVar8 == (wal_item *)0x0) goto LAB_0012c814;
      if (iterator->status == '\x01') {
        iterator->tree_cursor_prev = pwVar8;
        pwVar8 = wal_itr_next(iterator->wal_itr);
        iterator->tree_cursor = pwVar8;
        if (pwVar8 == (wal_item *)0x0) {
          uVar11 = local_140;
          if (hVar7 == HBTRIE_RESULT_SUCCESS) goto LAB_0012c814;
          goto LAB_0012c88d;
        }
      }
      iVar6 = -1;
      if ((hVar7 == HBTRIE_RESULT_SUCCESS) &&
         (iVar6 = _fdb_key_cmp(iterator,pwVar8->header->key,(ulong)pwVar8->header->keylen,pvVar12,
                               local_150), uVar11 = local_140, 0 < iVar6)) goto LAB_0012c814;
      wVar3 = pwVar8->action;
      if (wVar3 == '\x01') {
        bVar10 = ((byte)iterator->opt & 2) >> 1;
      }
      else {
        bVar10 = 0;
      }
      iterator->status = '\x01';
      if (-1 < iVar6) {
        *value_buf = 0xffffffffffffffff;
        if (wVar3 == '\x02' || bVar10 != 0) goto LAB_0012c613;
        break;
      }
    } while (wVar3 == '\x02' || bVar10 != 0);
    pvVar12 = pwVar8->header->key;
    local_150 = (size_t)pwVar8->header->keylen;
    uVar11 = pwVar8->offset;
LAB_0012c814:
    if (uVar11 == *value_buf) {
      iterator->_offset = 0xffffffffffffffff;
      iterator->status = '\0';
    }
    if (iterator->start_key == (void *)0x0) break;
    iVar6 = _fdb_key_cmp(iterator,iterator->start_key,(iterator->field_10).start_keylen,pvVar12,
                         local_150);
    if (iVar6 != 0) {
      if (iVar6 < 1) break;
      goto LAB_0012c613;
    }
  } while ((iterator->opt & 4) != 0);
  if (iterator->end_key == (void *)0x0) {
LAB_0012c990:
    iterator->_dhandle = local_f8;
    iterator->_get_offset = uVar11;
    goto LAB_0012c9a3;
  }
  iVar6 = _fdb_key_cmp(iterator,iterator->end_key,(iterator->field_12).end_keylen,pvVar12,local_150)
  ;
  if (iVar6 == 0) {
    fVar15 = FDB_RESULT_ITERATOR_FAIL;
    if ((iterator->opt & 8) == 0) goto LAB_0012c990;
  }
  else {
    if (-1 < iVar6) goto LAB_0012c990;
LAB_0012c88d:
    fVar15 = FDB_RESULT_ITERATOR_FAIL;
  }
  goto LAB_0012c8b7;
  while( true ) {
    iterator->status = '\x01';
    bVar16 = true;
    if ((((iterator->opt & 1) != 0) ||
        (pwVar8->action != '\x02' &&
         (pwVar8->action == '\x01' & (byte)((iterator->opt & 2) >> 1)) == 0)) &&
       (uVar13 = pwVar8->seqnum, iterator->_seqnum <= uVar13)) break;
LAB_0012c90d:
    if (bVar16) {
      iterator->tree_cursor_prev = pwVar8;
      pwVar8 = wal_itr_next(iterator->wal_itr);
      iterator->tree_cursor = pwVar8;
      if (pwVar8 == (wal_item *)0x0) goto LAB_0012c8af;
    }
  }
  if (uVar13 <= (iterator->field_12).end_seqnum) {
    local_158 = pwVar8->offset;
    iterator->_offset = local_158;
    iterator->_seqnum = uVar13;
LAB_0012c89f:
    iterator->_dhandle = handle;
    iterator->_get_offset = local_158;
    fVar15 = FDB_RESULT_SUCCESS;
  }
LAB_0012c8af:
  if (fVar15 == FDB_RESULT_SUCCESS) {
LAB_0012c9a3:
    iterator->direction = '\x01';
    fVar15 = FDB_RESULT_SUCCESS;
    goto LAB_0012c9a9;
  }
LAB_0012c8b7:
  iterator->_dhandle = (docio_handle *)0x0;
  if ((iterator->direction != '\0') &&
     (((iterator->seqtree_iterator != (btree_iterator *)0x0 ||
       (iterator->seqtrie_iterator != (hbtrie_iterator *)0x0)) && (iterator->status == '\0')))) {
    iterator->_offset = 0xffffffffffffffff;
  }
LAB_0012c9a9:
  paVar2 = &iterator->handle->handle_busy;
  LOCK();
  if ((paVar2->super___atomic_base<unsigned_char>)._M_i == '\x01') {
    (paVar2->super___atomic_base<unsigned_char>)._M_i = '\0';
  }
  UNLOCK();
  LOCK();
  paVar1 = &iterator->handle->op_stats->num_iterator_moves;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return fVar15;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_next(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status result = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (!atomic_cas_uint8_t(&iterator->handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (iterator->hbtrie_iterator) {
        while ((result = _fdb_iterator_next(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    } else {
        while ((result = _fdb_iterator_seq_next(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    }
    if (result == FDB_RESULT_SUCCESS) {
        iterator->direction = FDB_ITR_FORWARD;
    } else {
        iterator->_dhandle = NULL; // fail fdb_iterator_get also
        if (iterator->direction != FDB_ITR_DIR_NONE) {
            if ((iterator->seqtree_iterator || iterator->seqtrie_iterator) &&
                    iterator->status == FDB_ITR_IDX) {
                iterator->_offset = BLK_NOT_FOUND;
            }
        }
    }

    atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
    atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_moves,
                         std::memory_order_relaxed);
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_NEXT);
    return result;
}